

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptError.cpp
# Opt level: O3

bool Js::JavascriptError::ThrowIfNotExtensibleUndefinedSetter
               (PropertyOperationFlags flags,Var setterValue,ScriptContext *scriptContext)

{
  bool bVar1;
  
  if (((flags & PropertyOperation_ThrowIfNotExtensible) != PropertyOperation_None) &&
     (bVar1 = JavascriptOperators::IsUndefinedAccessor(setterValue,scriptContext), bVar1)) {
    bVar1 = ThreadContext::RecordImplicitException(scriptContext->threadContext);
    if (!bVar1) {
      return true;
    }
    ThrowTypeError(scriptContext,-0x7ff5ec2b,(PCWSTR)0x0);
  }
  return false;
}

Assistant:

bool JavascriptError::ThrowIfNotExtensibleUndefinedSetter(PropertyOperationFlags flags, Var setterValue, ScriptContext* scriptContext)
    {
        if ((flags & PropertyOperation_ThrowIfNotExtensible)
            && JavascriptOperators::IsUndefinedAccessor(setterValue, scriptContext))
        {
            if (scriptContext->GetThreadContext()->RecordImplicitException())
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_DefineProperty_NotExtensible);
            }
            return true;
        }
        return false;
    }